

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O2

void __thiscall
crnlib::vector<crnlib::find_files::file_desc>::insert
          (vector<crnlib::find_files::file_desc> *this,uint index,file_desc *p,uint n)

{
  uint uVar1;
  ulong uVar2;
  file_desc *pfVar3;
  int iVar4;
  bool bVar5;
  
  if (n != 0) {
    uVar2 = (ulong)n;
    uVar1 = this->m_size;
    resize(this,uVar1 + n,true);
    iVar4 = uVar1 - index;
    pfVar3 = this->m_p + uVar1;
    while( true ) {
      pfVar3 = pfVar3 + -1;
      bVar5 = iVar4 == 0;
      iVar4 = iVar4 + -1;
      if (bVar5) break;
      find_files::file_desc::operator=(pfVar3 + uVar2,pfVar3);
    }
    pfVar3 = this->m_p + index;
    while (iVar4 = (int)uVar2, uVar2 = (ulong)(iVar4 - 1), iVar4 != 0) {
      find_files::file_desc::operator=(pfVar3,p);
      pfVar3 = pfVar3 + 1;
      p = p + 1;
    }
  }
  return;
}

Assistant:

inline void insert(uint index, const T* p, uint n)
        {
            CRNLIB_ASSERT(index <= m_size);
            if (!n)
            {
                return;
            }

            const uint orig_size = m_size;
            resize(m_size + n, true);

            const uint num_to_move = orig_size - index;

            if (CRNLIB_IS_BITWISE_COPYABLE(T))
            {
                // This overwrites the destination object bits, but bitwise copyable means we don't need to worry about destruction.
                memmove(m_p + index + n, m_p + index, sizeof(T) * num_to_move);
            }
            else
            {
                const T* pSrc = m_p + orig_size - 1;
                T* pDst = const_cast<T*>(pSrc) + n;

                for (uint i = 0; i < num_to_move; i++)
                {
                    CRNLIB_ASSERT((pDst - m_p) < (int)m_size);
                    *pDst-- = *pSrc--;
                }
            }

            T* pDst = m_p + index;

            if (CRNLIB_IS_BITWISE_COPYABLE(T))
            {
                // This copies in the new bits, overwriting the existing objects, which is OK for copyable types that don't need destruction.
                memcpy(pDst, p, sizeof(T) * n);
            }
            else
            {
                for (uint i = 0; i < n; i++)
                {
                    CRNLIB_ASSERT((pDst - m_p) < (int)m_size);
                    *pDst++ = *p++;
                }
            }
        }